

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::PoisonSingleGroupEmptySlots
          (HashSetResizeHelper *this,CommonFields *c,size_t slot_size)

{
  bool bVar1;
  size_t sVar2;
  ctrl_t *pcVar3;
  void *pvVar4;
  ulong local_28;
  size_t i;
  size_t slot_size_local;
  CommonFields *c_local;
  HashSetResizeHelper *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar2 = CommonFields::capacity(c);
    if (sVar2 <= local_28) break;
    pcVar3 = CommonFields::control(c);
    bVar1 = IsFull(pcVar3[local_28]);
    if (!bVar1) {
      pvVar4 = CommonFields::slot_array(c);
      pvVar4 = SlotAddress(pvVar4,local_28,slot_size);
      SanitizerPoisonMemoryRegion(pvVar4,slot_size);
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void PoisonSingleGroupEmptySlots(CommonFields& c, size_t slot_size) const {
    // poison non full items
    for (size_t i = 0; i < c.capacity(); ++i) {
      if (!IsFull(c.control()[i])) {
        SanitizerPoisonMemoryRegion(SlotAddress(c.slot_array(), i, slot_size),
                                    slot_size);
      }
    }
  }